

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Transpose<3,_3>::doApply
          (IRet *__return_storage_ptr__,Transpose<3,_3> *this,EvalContext *param_1,IArgs *iargs)

{
  bool *pbVar1;
  double dVar2;
  Vector<tcu::Interval,_3> *pVVar3;
  long lVar4;
  Vector<tcu::Interval,_3> *pVVar5;
  long lVar6;
  Vector<tcu::Interval,_3> *pVVar7;
  
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix(__return_storage_ptr__);
  pVVar3 = (Vector<tcu::Interval,_3> *)iargs->a;
  lVar4 = 0;
  pVVar5 = (Vector<tcu::Interval,_3> *)__return_storage_ptr__;
  do {
    lVar6 = -0x48;
    pVVar7 = pVVar5;
    do {
      ((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar7->m_data)->m_data[0].m_data[0].m_hi =
           *(double *)((long)&pVVar3[1].m_data[0].m_hi + lVar6);
      pbVar1 = &pVVar3[1].m_data[0].m_hasNaN + lVar6;
      dVar2 = *(double *)(pbVar1 + 8);
      *(undefined8 *)((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar7->m_data)->m_data[0].m_data
           = *(undefined8 *)pbVar1;
      ((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar7->m_data)->m_data[0].m_data[0].m_lo = dVar2
      ;
      pVVar7 = pVVar7 + 1;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0);
    lVar4 = lVar4 + 1;
    pVVar3 = pVVar3 + 1;
    pVVar5 = (Vector<tcu::Interval,_3> *)(pVVar5->m_data + 1);
  } while (lVar4 != 3);
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&, const IArgs& iargs) const
	{
		IRet ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
		{
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = iargs.a(colNdx, rowNdx);
		}

		return ret;
	}